

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerateutils.cpp
# Opt level: O2

string * cppgenerate::uppercase(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (input->_M_dataplus)._M_p;
  for (pcVar2 = pcVar1; pcVar2 != pcVar1 + input->_M_string_length; pcVar2 = pcVar2 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    pcVar1 = (input->_M_dataplus)._M_p;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cppgenerate::uppercase( std::string input ){
    std::string newString;
    std::string::const_iterator it = input.begin();

    while( it != input.end() ){
        char c = *it;
        newString.push_back( uppercaseChar( c ) );
        it++;
    }

    return newString;
}